

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string_view __thiscall google::protobuf::Symbol::full_name(Symbol *this)

{
  uint8_t uVar1;
  byte bVar2;
  long *plVar3;
  FeatureSet *this_00;
  ulong uVar4;
  FileDescriptor *pFVar5;
  string *extraout_RAX;
  string *psVar6;
  size_t extraout_RAX_00;
  size_t extraout_RAX_01;
  size_t sVar7;
  undefined8 *puVar8;
  SymbolBase *pSVar9;
  SymbolBase *pSVar10;
  uint uVar11;
  SymbolBase *pSVar12;
  SymbolBase *extraout_RDX;
  SymbolBase *extraout_RDX_00;
  SymbolBase *extraout_RDX_01;
  SymbolBase *extraout_RDX_02;
  SymbolBase *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *pcVar13;
  int iVar14;
  uint *this_01;
  long *plVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  string_view sVar21;
  string_view sVar22;
  string_view sVar23;
  string_view sVar24;
  string_view sVar25;
  undefined8 auStack_90 [2];
  undefined1 *puStack_80;
  long lStack_78;
  ulong uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_40 [16];
  long local_10 [2];
  
  pSVar10 = this->ptr_;
  uVar1 = pSVar10->symbol_type_;
  this_01 = &switchD_002076ec::switchdataD_00351014;
  switch(uVar1) {
  case '\x01':
    bVar20 = uVar1 == '\x01';
    break;
  case '\x02':
    bVar20 = uVar1 == '\x02';
    break;
  case '\x03':
    bVar20 = uVar1 == '\x03';
    break;
  case '\x04':
    bVar20 = uVar1 == '\x04';
    break;
  case '\x05':
    lVar18 = *(long *)(pSVar10 + (8 - (ulong)(uVar1 != '\x05')));
    goto LAB_00207764;
  default:
    plVar15 = local_10;
    full_name();
    puVar16 = auStack_40;
    pSVar10 = ((Symbol *)this_01)->ptr_;
    bVar2 = pSVar10->symbol_type_;
    uVar11 = bVar2 - 1;
    if (7 < uVar11) {
      parent_name_key();
      puVar17 = auStack_68;
      iVar14 = (int)this_01;
      lVar18 = (long)iVar14;
      if (iVar14 < 0) {
        uStack_70 = 0x207908;
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (0,lVar18,"0 <= index");
        pcVar13 = extraout_RDX_05;
      }
      else {
        psVar6 = (string *)0x0;
        pcVar13 = extraout_RDX_04;
      }
      if (psVar6 == (string *)0x0) {
        if (iVar14 < *(int *)(puVar16 + 4)) {
          psVar6 = (string *)0x0;
        }
        else {
          uStack_70 = 0x207919;
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar18,(long)*(int *)(puVar16 + 4),"index < field_count()");
          pcVar13 = extraout_RDX_06;
        }
        if (psVar6 == (string *)0x0) {
          sVar23._M_len = lVar18 * 0x58 + *(long *)(puVar16 + 0x38);
          sVar23._M_str = pcVar13;
          return sVar23;
        }
      }
      else {
        uStack_70 = 0x207926;
        Descriptor::field();
        psVar6 = extraout_RAX;
      }
      iVar14 = (int)psVar6;
      uStack_70 = 0x207931;
      Descriptor::field();
      puVar8 = auStack_90;
      lVar19 = (long)iVar14;
      puStack_80 = puVar16;
      lStack_78 = lVar18;
      uStack_70 = (ulong)this_01 & 0xffffffff;
      if (iVar14 < 0) {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (0,lVar19,"0 <= index");
        pcVar13 = extraout_RDX_08;
      }
      else {
        psVar6 = (string *)0x0;
        pcVar13 = extraout_RDX_07;
      }
      if (psVar6 == (string *)0x0) {
        if (iVar14 < *(int *)(puVar17 + 4)) {
          psVar6 = (string *)0x0;
        }
        else {
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar19,(long)*(int *)(puVar17 + 4),"index < value_count()");
          pcVar13 = extraout_RDX_09;
        }
        if (psVar6 == (string *)0x0) {
          sVar24._M_len = lVar19 * 0x30 + *(long *)(puVar17 + 0x38);
          sVar24._M_str = pcVar13;
          return sVar24;
        }
      }
      else {
        EnumDescriptor::value();
      }
      EnumDescriptor::value();
      this_00 = (FeatureSet *)*puVar8;
      sVar7 = extraout_RAX_00;
      pcVar13 = extraout_RDX_10;
      if (this_00 != (FeatureSet *)0x0) {
        FeatureSet::~FeatureSet(this_00);
        operator_delete(this_00,0x48);
        sVar7 = extraout_RAX_01;
        pcVar13 = extraout_RDX_11;
      }
      *puVar8 = 0;
      sVar25._M_str = pcVar13;
      sVar25._M_len = sVar7;
      return sVar25;
    }
    pSVar12 = (SymbolBase *)
              ((long)&switchD_002077ad::switchdataD_0035103c +
              (long)(int)(&switchD_002077ad::switchdataD_0035103c)[uVar11]);
    switch((uint)bVar2) {
    case 1:
      pSVar12 = (SymbolBase *)0x0;
      if (bVar2 == 1) {
        pSVar12 = pSVar10;
      }
      pFVar5 = *(FileDescriptor **)(pSVar12 + 0x18);
      if (pFVar5 == (FileDescriptor *)0x0) {
        pFVar5 = GetFile((Symbol *)this_01);
        pSVar12 = extraout_RDX;
      }
      pSVar10 = ((Symbol *)this_01)->ptr_;
      bVar20 = pSVar10->symbol_type_ == '\x01';
      goto LAB_0020788c;
    case 2:
      pSVar9 = (SymbolBase *)0x0;
      if (bVar2 == 2) {
        pSVar9 = pSVar10;
      }
      pFVar5 = *(FileDescriptor **)(pSVar9 + (ulong)(pSVar9[1].symbol_type_ & 8) + 0x20);
      if (pFVar5 == (FileDescriptor *)0x0) {
        pFVar5 = GetFile((Symbol *)this_01);
        pSVar12 = extraout_RDX_02;
      }
      break;
    case 3:
      bVar20 = bVar2 == 3;
      goto LAB_00207839;
    case 4:
      pSVar12 = (SymbolBase *)0x0;
      if (bVar2 == 4) {
        pSVar12 = pSVar10;
      }
      pFVar5 = *(FileDescriptor **)(pSVar12 + 0x18);
      if (pFVar5 == (FileDescriptor *)0x0) {
        pFVar5 = GetFile((Symbol *)this_01);
        pSVar12 = extraout_RDX_01;
      }
      pSVar10 = ((Symbol *)this_01)->ptr_;
      bVar20 = pSVar10->symbol_type_ == '\x04';
      goto LAB_0020788c;
    case 5:
      pSVar12 = (SymbolBase *)(ulong)(bVar2 != 5);
      pFVar5 = *(FileDescriptor **)(*(long *)(pSVar10 + (0x10 - (long)pSVar12)) + 0x18);
      if (pFVar5 == (FileDescriptor *)0x0) {
        pFVar5 = GetFile((Symbol *)this_01);
        pSVar12 = extraout_RDX_00;
      }
      pSVar9 = ((Symbol *)this_01)->ptr_ +
               -(ulong)(((Symbol *)this_01)->ptr_->symbol_type_ != '\x05');
      break;
    case 6:
      pSVar12 = (SymbolBase *)(ulong)(bVar2 != 5);
      pSVar9 = pSVar10 + -(long)pSVar12;
      pFVar5 = *(FileDescriptor **)(pSVar9 + 0x10);
      break;
    case 7:
      pFVar5 = GetFile((Symbol *)this_01);
      pSVar10 = ((Symbol *)this_01)->ptr_;
      bVar20 = pSVar10->symbol_type_ == '\a';
      pSVar12 = extraout_RDX_03;
LAB_0020788c:
      pSVar9 = (SymbolBase *)0x0;
      if (bVar20) {
        pSVar9 = pSVar10;
      }
      break;
    case 8:
      bVar20 = bVar2 == 8;
LAB_00207839:
      pSVar9 = (SymbolBase *)0x0;
      if (bVar20) {
        pSVar9 = pSVar10;
      }
      pFVar5 = *(FileDescriptor **)(pSVar9 + 0x10);
    }
    plVar3 = *(long **)(pSVar9 + 8);
    *plVar15 = (long)pFVar5;
    lVar18 = *plVar3;
    plVar15[1] = plVar3[1];
    plVar15[2] = lVar18;
    sVar22._M_str = (char *)pSVar12;
    sVar22._M_len = (size_t)plVar15;
    return sVar22;
  case '\a':
    bVar20 = uVar1 == '\a';
    break;
  case '\b':
    bVar20 = uVar1 == '\b';
    break;
  case '\t':
    pSVar12 = (SymbolBase *)0x0;
    if (uVar1 == '\t') {
      pSVar12 = pSVar10;
    }
    puVar8 = *(undefined8 **)(pSVar12 + 0x10);
    uVar4 = puVar8[1];
    goto LAB_0020776c;
  case '\n':
    pSVar12 = (SymbolBase *)0x0;
    if (uVar1 == '\n') {
      pSVar12 = pSVar10;
    }
    puVar8 = *(undefined8 **)(*(long *)(pSVar12 + 8) + 0x10);
    uVar4 = (long)*(int *)(pSVar12 + 4);
    if ((ulong)puVar8[1] < (ulong)(long)*(int *)(pSVar12 + 4)) {
      uVar4 = puVar8[1];
    }
    goto LAB_0020776c;
  }
  pSVar12 = (SymbolBase *)0x0;
  if (bVar20) {
    pSVar12 = pSVar10;
  }
  lVar18 = *(long *)(pSVar12 + 8);
LAB_00207764:
  puVar8 = (undefined8 *)(lVar18 + 0x20);
  uVar4 = *(ulong *)(lVar18 + 0x28);
LAB_0020776c:
  sVar21._M_str = (char *)*puVar8;
  sVar21._M_len = uVar4;
  return sVar21;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }